

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_zero_initialized_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t type_id)

{
  uint32_t id_00;
  SPIRType *pSVar1;
  SPIRConstant *pSVar2;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  bool bVar3;
  uint32_t id;
  SPIRType *type;
  uint32_t type_id_local;
  CompilerGLSL *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,type_id);
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(this_00,in_EDX);
  bVar3 = true;
  if ((pSVar1->storage != StorageClassPrivate) &&
     (bVar3 = true, pSVar1->storage != StorageClassFunction)) {
    bVar3 = pSVar1->storage == StorageClassGeneric;
  }
  if (!bVar3) {
    __assert_fail("type.storage == StorageClassPrivate || type.storage == StorageClassFunction || type.storage == StorageClassGeneric"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x3b45,
                  "virtual string spirv_cross::CompilerGLSL::to_zero_initialized_expression(uint32_t)"
                 );
  }
  id_00 = ParsedIR::increase_bound_by(&this_00->ir,1);
  ParsedIR::make_constant_null(&this_00->ir,id_00,in_EDX,false);
  pSVar2 = Compiler::get<spirv_cross::SPIRConstant>(this_00,id_00);
  constant_expression_abi_cxx11_(this,(SPIRConstant *)this_00,SUB81(pSVar2,0),false);
  return this;
}

Assistant:

string CompilerGLSL::to_zero_initialized_expression(uint32_t type_id)
{
#ifndef NDEBUG
	auto &type = get<SPIRType>(type_id);
	assert(type.storage == StorageClassPrivate || type.storage == StorageClassFunction ||
	       type.storage == StorageClassGeneric);
#endif
	uint32_t id = ir.increase_bound_by(1);
	ir.make_constant_null(id, type_id, false);
	return constant_expression(get<SPIRConstant>(id));
}